

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

void __thiscall mkvmuxer::Cluster::~Cluster(Cluster *this)

{
  map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
  *this_00;
  _Base_ptr *pp_Var1;
  _Base_ptr p_Var2;
  Frame *this_01;
  _Base_ptr p_Var3;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
  pVar4;
  
  this_00 = &this->stored_frames_;
  while ((this->stored_frames_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    while( true ) {
      p_Var2 = (this->stored_frames_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if (p_Var2[1]._M_parent == (_Base_ptr)&p_Var2[1]._M_parent) break;
      this_01 = (Frame *)(p_Var2[1]._M_parent)->_M_left;
      if (this_01 != (Frame *)0x0) {
        Frame::~Frame(this_01);
        operator_delete(this_01);
      }
      p_Var2 = (this->stored_frames_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var3 = p_Var2[1]._M_parent;
      pp_Var1 = &p_Var2[1]._M_right;
      *pp_Var1 = (_Base_ptr)((long)&(*pp_Var1)[-1]._M_right + 7);
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(p_Var3);
    }
    pVar4 = std::
            _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
            ::equal_range(&this_00->_M_t,(key_type *)(p_Var2 + 1));
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
    ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar4.first._M_node,(_Base_ptr)pVar4.second._M_node);
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::~_Rb_tree(&(this->last_block_timestamp_)._M_t);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
  ::~_Rb_tree(&this_00->_M_t);
  return;
}

Assistant:

Cluster::~Cluster() {
  // Delete any stored frames that are left behind. This will happen if the
  // Cluster was not Finalized for whatever reason.
  while (!stored_frames_.empty()) {
    while (!stored_frames_.begin()->second.empty()) {
      delete stored_frames_.begin()->second.front();
      stored_frames_.begin()->second.pop_front();
    }
    stored_frames_.erase(stored_frames_.begin()->first);
  }
}